

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::
Own<kj::ConstFunction<void_(capnp::compiler::Expression::Builder)>::Impl<const_kj::ConstFunction<void_(capnp::compiler::Expression::Builder)>::Iface_&>_>
::dispose(Own<kj::ConstFunction<void_(capnp::compiler::Expression::Builder)>::Impl<const_kj::ConstFunction<void_(capnp::compiler::Expression::Builder)>::Iface_&>_>
          *this)

{
  Impl<const_kj::ConstFunction<void_(capnp::compiler::Expression::Builder)>::Iface_&> *object;
  Impl<const_kj::ConstFunction<void_(capnp::compiler::Expression::Builder)>::Iface_&> *ptrCopy;
  Own<kj::ConstFunction<void_(capnp::compiler::Expression::Builder)>::Impl<const_kj::ConstFunction<void_(capnp::compiler::Expression::Builder)>::Iface_&>_>
  *this_local;
  
  object = this->ptr;
  if (object != (Impl<const_kj::ConstFunction<void_(capnp::compiler::Expression::Builder)>::Iface_&>
                 *)0x0) {
    this->ptr = (Impl<const_kj::ConstFunction<void_(capnp::compiler::Expression::Builder)>::Iface_&>
                 *)0x0;
    Disposer::
    dispose<kj::ConstFunction<void(capnp::compiler::Expression::Builder)>::Impl<kj::ConstFunction<void(capnp::compiler::Expression::Builder)>::Iface_const&>>
              (this->disposer,object);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }